

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathEllipticalArcTo
          (ImDrawList *this,ImVec2 *center,ImVec2 *radius,float rot,float a_min,float a_max,
          int num_segments)

{
  int iVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  ImVec2 local_60;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  if (num_segments < 1) {
    uVar2 = -(uint)(radius->y <= radius->x);
    num_segments = _CalcCircleAutoSegmentCount
                             (this,(float)(~uVar2 & (uint)radius->y | (uint)radius->x & uVar2));
  }
  ImVector<ImVec2>::reserve(&this->_Path,(this->_Path).Size + num_segments + 1);
  fVar3 = cosf(rot);
  fStack_54 = sinf(rot);
  local_58 = fVar3;
  local_48 = fStack_54;
  fStack_44 = fVar3;
  for (iVar1 = 0; num_segments + 1 != iVar1; iVar1 = iVar1 + 1) {
    fVar3 = ((float)iVar1 / (float)num_segments) * (a_max - a_min) + a_min;
    fVar4 = cosf(fVar3);
    fVar4 = fVar4 * radius->x;
    fVar3 = sinf(fVar3);
    fVar3 = fVar3 * radius->y;
    local_60.x = (*center).x + fVar4 * local_58 + -fVar3 * local_48;
    local_60.y = (*center).y + fVar4 * fStack_54 + fVar3 * fStack_44;
    ImVector<ImVec2>::push_back(&this->_Path,&local_60);
  }
  return;
}

Assistant:

void ImDrawList::PathEllipticalArcTo(const ImVec2& center, const ImVec2& radius, float rot, float a_min, float a_max, int num_segments)
{
    if (num_segments <= 0)
        num_segments = _CalcCircleAutoSegmentCount(ImMax(radius.x, radius.y)); // A bit pessimistic, maybe there's a better computation to do here.

    _Path.reserve(_Path.Size + (num_segments + 1));

    const float cos_rot = ImCos(rot);
    const float sin_rot = ImSin(rot);
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        ImVec2 point(ImCos(a) * radius.x, ImSin(a) * radius.y);
        const ImVec2 rel((point.x * cos_rot) - (point.y * sin_rot), (point.x * sin_rot) + (point.y * cos_rot));
        point.x = rel.x + center.x;
        point.y = rel.y + center.y;
        _Path.push_back(point);
    }
}